

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::DBTest_IterEmpty_Test::TestBody(DBTest_IterEmpty_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined4 extraout_var;
  char *message;
  internal local_58 [8];
  undefined8 *local_50;
  AssertHelper local_48;
  string local_40;
  Iterator *iter;
  
  local_40._M_string_length = 0;
  local_40._M_dataplus._M_p = (pointer)0x100;
  iVar3 = (*((this->super_DBTest).db_)->_vptr_DB[6])();
  iter = (Iterator *)CONCAT44(extraout_var,iVar3);
  (*iter->_vptr_Iterator[3])(iter);
  DBTest::IterStatus_abi_cxx11_(&local_40,&this->super_DBTest,iter);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
            (local_58,"IterStatus(iter)","\"(invalid)\"",&local_40,(char (*) [10])"(invalid)");
  paVar1 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  puVar2 = local_50;
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_50 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_50;
    }
    iVar3 = 0x30b;
  }
  else {
    if (local_50 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_50 != local_50 + 2) {
        operator_delete((undefined8 *)*local_50);
      }
      operator_delete(puVar2);
    }
    (*iter->_vptr_Iterator[4])(iter);
    DBTest::IterStatus_abi_cxx11_(&local_40,&this->super_DBTest,iter);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
              (local_58,"IterStatus(iter)","\"(invalid)\"",&local_40,(char (*) [10])"(invalid)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    puVar2 = local_50;
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_40);
      if (local_50 == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = (char *)*local_50;
      }
      iVar3 = 0x30e;
    }
    else {
      if (local_50 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_50 != local_50 + 2) {
          operator_delete((undefined8 *)*local_50);
        }
        operator_delete(puVar2);
      }
      local_40._M_dataplus._M_p = "foo";
      local_40._M_string_length = 3;
      (*iter->_vptr_Iterator[5])(iter);
      DBTest::IterStatus_abi_cxx11_(&local_40,&this->super_DBTest,iter);
      testing::internal::CmpHelperEQ<std::__cxx11::string,char[10]>
                (local_58,"IterStatus(iter)","\"(invalid)\"",&local_40,(char (*) [10])"(invalid)");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      if (local_58[0] != (internal)0x0) {
        if (local_50 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_50 != local_50 + 2) {
            operator_delete((undefined8 *)*local_50);
          }
          operator_delete(local_50);
        }
        (*iter->_vptr_Iterator[1])(iter);
        return;
      }
      testing::Message::Message((Message *)&local_40);
      if (local_50 == (undefined8 *)0x0) {
        message = "";
      }
      else {
        message = (char *)*local_50;
      }
      iVar3 = 0x311;
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
             ,iVar3,message);
  testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if ((long *)local_40._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_40._M_dataplus._M_p + 8))();
  }
  if (local_50 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_50 != local_50 + 2) {
      operator_delete((undefined8 *)*local_50);
    }
    operator_delete(local_50);
  }
  return;
}

Assistant:

TEST_F(DBTest, IterEmpty) {
  Iterator* iter = db_->NewIterator(ReadOptions());

  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->Seek("foo");
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  delete iter;
}